

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTLogicExpression.cpp
# Opt level: O0

void __thiscall MathML::AST::LogicExpression::~LogicExpression(LogicExpression *this)

{
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *pvVar1;
  reference ppIVar2;
  INode *in_RDI;
  size_t i;
  size_type in_stack_ffffffffffffffc8;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *in_stack_ffffffffffffffd0;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *this_00;
  vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *local_10;
  
  in_RDI->_vptr_INode = (_func_int **)&PTR__LogicExpression_00e6d9b0;
  local_10 = (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)0x0;
  while( true ) {
    this_00 = local_10;
    pvVar1 = (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
             std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::size
                       ((vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
                        (in_RDI + 1));
    if (pvVar1 <= this_00) break;
    ppIVar2 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::at
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 =
         (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)*ppIVar2;
    if (in_stack_ffffffffffffffd0 !=
        (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)0x0) {
      (*(code *)(in_stack_ffffffffffffffd0->
                super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>).
                _M_impl.super__Vector_impl_data._M_start[1])();
    }
    local_10 = (vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_> *)
               ((long)&(local_10->
                       super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::~vector(this_00);
  INode::~INode(in_RDI);
  return;
}

Assistant:

LogicExpression::~LogicExpression()
        {
            for (size_t i=0; i<mOperands.size(); ++i)
            {
                delete mOperands.at( i );
            }
        }